

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(CategoricalMapping *a,CategoricalMapping *b)

{
  uint32_t uVar1;
  bool bVar2;
  
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 != 0) {
    if (uVar1 == 1) {
      bVar2 = operator==(&(((a->MappingType_).stringtoint64map_)->map_).map_,
                         &(((b->MappingType_).stringtoint64map_)->map_).map_);
      return bVar2;
    }
    bVar2 = operator==((Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&((a->MappingType_).stringtoint64map_)->map_,
                       (Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&((b->MappingType_).stringtoint64map_)->map_);
    return bVar2;
  }
  return true;
}

Assistant:

inline CategoricalMapping::MappingTypeCase CategoricalMapping::MappingType_case() const {
  return CategoricalMapping::MappingTypeCase(_oneof_case_[0]);
}